

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

int cs_impl::file_system::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  ifstream in;
  ofstream out;
  char buffer [256];
  long local_520 [4];
  byte abStack_500 [488];
  long local_318;
  filebuf local_310 [24];
  byte abStack_2f8 [216];
  ios_base local_220 [264];
  undefined1 local_118 [256];
  
  std::ifstream::ifstream(local_520,(string *)dst,_S_in|_S_bin);
  std::ofstream::ofstream(&local_318,(string *)src,_S_out|_S_bin);
  if (((abStack_500[*(long *)(local_520[0] + -0x18)] & 5) == 0) &&
     ((abStack_2f8[*(long *)(local_318 + -0x18)] & 5) == 0)) {
    while ((abStack_500[*(long *)(local_520[0] + -0x18)] & 2) == 0) {
      std::istream::read((char *)local_520,(long)local_118);
      std::ostream::write((char *)&local_318,(long)local_118);
    }
    iVar1 = (int)CONCAT71((int7)((ulong)local_520 >> 8),1);
  }
  else {
    iVar1 = 0;
  }
  local_318 = _VTT;
  *(undefined8 *)(local_310 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_310);
  std::ios_base::~ios_base(local_220);
  std::ifstream::~ifstream(local_520);
  return iVar1;
}

Assistant:

bool copy(const std::string &source, const std::string &dest)
		{
			std::ifstream in(source, std::ios_base::in | std::ios_base::binary);
			std::ofstream out(dest, std::ios_base::out | std::ios_base::binary);
			if (!in || !out)
				return false;
			char buffer[256];
			while (!in.eof()) {
				in.read(buffer, 256);
				out.write(buffer, in.gcount());
			}
			return true;
		}